

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

void stackjit::TestLibrary::add(VMState *vmState)

{
  Binder *this;
  TypeProvider *pTVar1;
  Type *pTVar2;
  Type *returnType;
  PrimitiveTypes primitiveType;
  PrimitiveTypes primitiveType_00;
  initializer_list<const_stackjit::Type_*> __l;
  initializer_list<const_stackjit::Type_*> __l_00;
  allocator_type local_231;
  Type *local_230;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_228;
  vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_> local_210;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  FunctionDefinition local_158;
  FunctionDefinition local_c0;
  
  this = VMState::binder(vmState);
  pTVar1 = VMState::typeProvider(vmState);
  TypeSystem::toString_abi_cxx11_(&local_178,(TypeSystem *)0x1,primitiveType);
  pTVar2 = TypeProvider::makeType(pTVar1,&local_178);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  pTVar1 = VMState::typeProvider(vmState);
  TypeSystem::toString_abi_cxx11_(&local_198,(TypeSystem *)0x0,primitiveType_00);
  returnType = TypeProvider::makeType(pTVar1,&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"rt.test.fib","");
  __l._M_len = 1;
  __l._M_array = &local_230;
  local_230 = pTVar2;
  std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
            (&local_210,__l,&local_231);
  FunctionDefinition::FunctionDefinition
            (&local_c0,&local_1d8,&local_210,pTVar2,(BytePtr)fibonacci,(ClassType *)0x0,Public,false
            );
  Binder::define(this,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mMemberName._M_dataplus._M_p != &local_c0.mMemberName.field_2) {
    operator_delete(local_c0.mMemberName._M_dataplus._M_p);
  }
  if (local_c0.mCallParameters.
      super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.mCallParameters.
                    super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.mParameters.
      super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.mParameters.
                    super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.mName._M_dataplus._M_p != &local_c0.mName.field_2) {
    operator_delete(local_c0.mName._M_dataplus._M_p);
  }
  if (local_210.super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_210.
                    super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  pTVar1 = VMState::typeProvider(vmState);
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"Ref.Point","");
  pTVar2 = TypeProvider::makeType(pTVar1,&local_1b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p);
  }
  if (pTVar2 != (Type *)0x0) {
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"rt.test.println","");
    __l_00._M_len = 1;
    __l_00._M_array = &local_230;
    local_230 = pTVar2;
    std::vector<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>::vector
              (&local_228,__l_00,&local_231);
    FunctionDefinition::FunctionDefinition
              (&local_158,&local_1f8,&local_228,returnType,(BytePtr)printPoint,(ClassType *)0x0,
               Public,false);
    Binder::define(this,&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.mMemberName._M_dataplus._M_p != &local_158.mMemberName.field_2) {
      operator_delete(local_158.mMemberName._M_dataplus._M_p);
    }
    if (local_158.mCallParameters.
        super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.mCallParameters.
                      super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_158.mParameters.
        super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_158.mParameters.
                      super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158.mName._M_dataplus._M_p != &local_158.mName.field_2) {
      operator_delete(local_158.mName._M_dataplus._M_p);
    }
    if (local_228.
        super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_228.
                      super__Vector_base<const_stackjit::Type_*,_std::allocator<const_stackjit::Type_*>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void TestLibrary::add(VMState& vmState) {
		auto& binder = vmState.binder();
		auto intType = vmState.typeProvider().makeType(TypeSystem::toString(PrimitiveTypes::Integer));
		auto voidType = vmState.typeProvider().makeType(TypeSystem::toString(PrimitiveTypes::Void));

		binder.define(FunctionDefinition("rt.test.fib", { intType }, intType, (BytePtr)(&fibonacci)));

		auto pointType = vmState.typeProvider().makeType("Ref.Point");
		if (pointType != nullptr) {
			binder.define(FunctionDefinition("rt.test.println", { pointType }, voidType, (BytePtr)(&printPoint)));
		}
	}